

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# latency_collector.h
# Opt level: O2

map<double,_unsigned_long,_std::less<double>,_std::allocator<std::pair<const_double,_unsigned_long>_>_>
* __thiscall
LatencyItem::dumpHistogram
          (map<double,_unsigned_long,_std::less<double>,_std::allocator<std::pair<const_double,_unsigned_long>_>_>
           *__return_storage_ptr__,LatencyItem *this)

{
  _Rb_tree_header *p_Var1;
  HistItr *entry;
  iterator __begin1;
  ulong local_38;
  int local_30;
  undefined4 uStack_2c;
  long local_28;
  pair<unsigned_long,_unsigned_long> local_20;
  
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  Histogram::begin(&this->hist);
  while (local_38 != 0x41) {
    local_20.second = *(unsigned_long *)(*(long *)(local_28 + 0x10) + local_38 * 8);
    if (local_20.second != 0) {
      local_20.first = -(ulong)(local_38 == 0) | 1L << ((ulong)(~(uint)local_38 + local_30) & 0x3f);
      std::
      _Rb_tree<double,std::pair<double_const,unsigned_long>,std::_Select1st<std::pair<double_const,unsigned_long>>,std::less<double>,std::allocator<std::pair<double_const,unsigned_long>>>
      ::_M_emplace_unique<std::pair<unsigned_long,unsigned_long>>
                ((_Rb_tree<double,std::pair<double_const,unsigned_long>,std::_Select1st<std::pair<double_const,unsigned_long>>,std::less<double>,std::allocator<std::pair<double_const,unsigned_long>>>
                  *)__return_storage_ptr__,&local_20);
    }
    local_38 = local_38 + 1;
    if (CONCAT44(uStack_2c,local_30) <= local_38) {
      local_38 = CONCAT44(uStack_2c,local_30);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::map<double, uint64_t> dumpHistogram() const {
        std::map<double, uint64_t> ret;
        for (auto& entry: hist) {
            HistItr& itr = entry;
            uint64_t cnt = itr.getCount();
            if (cnt) {
                ret.insert( std::make_pair(itr.getUpperBound(), cnt) );
            }
        }
        return ret;
    }